

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qeventpoint.cpp
# Opt level: O3

void QEventPoint::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (_c == WriteProperty) {
    if ((_id == 0) && (*(long *)_o != 0)) {
      *(undefined1 *)(*(long *)_o + 0xdd) = **_a;
      return;
    }
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if (0x18 < (uint)_id) {
    return;
  }
  pauVar1 = (undefined1 (*) [16])*_a;
  switch(_id) {
  case 0:
    if (*(long *)_o != 0) {
      uVar3 = *(undefined1 *)(*(long *)_o + 0xdd);
      goto LAB_002bf10f;
    }
    goto LAB_002bf10d;
  case 1:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined8 *)(*(long *)_o + 8);
      goto LAB_002bf045;
    }
    goto LAB_002bf043;
  case 2:
    if (*(long *)_o == 0) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = *(undefined4 *)(*(long *)_o + 0xd8);
    }
    *(undefined4 *)*pauVar1 = uVar6;
    return;
  case 3:
    if (*(long *)_o == 0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar4 = *(undefined8 *)(*(long *)_o + 0xd0);
    }
    goto LAB_002bf045;
  case 4:
    if (*(long *)_o != 0) {
      uVar3 = *(undefined1 *)(*(long *)_o + 0xdc);
      goto LAB_002bf10f;
    }
LAB_002bf10d:
    uVar3 = 0;
LAB_002bf10f:
    (*pauVar1)[0] = uVar3;
    return;
  case 5:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined8 *)(*(long *)_o + 0xb8);
      goto LAB_002bf045;
    }
    goto LAB_002bf043;
  case 6:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined8 *)(*(long *)_o + 200);
      goto LAB_002bf045;
    }
    goto LAB_002bf043;
  case 7:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined8 *)(*(long *)_o + 0xc0);
      goto LAB_002bf045;
    }
LAB_002bf043:
    uVar4 = 0;
LAB_002bf045:
    *(undefined8 *)*pauVar1 = uVar4;
    return;
  case 8:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      lVar5 = *(long *)(lVar5 + 0xb8) - *(long *)(lVar5 + 200);
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      dVar10 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000.0;
      goto LAB_002bf0c0;
    }
    goto LAB_002bf0bc;
  case 9:
    if (*(long *)_o != 0) {
      dVar10 = *(double *)(*(long *)_o + 0x90);
      goto LAB_002bf0c0;
    }
    goto LAB_002bf0bc;
  case 10:
    if (*(long *)_o != 0) {
      dVar10 = *(double *)(*(long *)_o + 0x98);
      goto LAB_002bf0c0;
    }
LAB_002bf0bc:
    dVar10 = 0.0;
LAB_002bf0c0:
    *(double *)*pauVar1 = dVar10;
    return;
  case 0xb:
    lVar5 = *(long *)_o;
    if (lVar5 == 0) {
      dVar10 = -1.0;
      dVar12 = -1.0;
    }
    else {
      dVar10 = *(double *)(lVar5 + 0xa0);
      dVar12 = *(double *)(lVar5 + 0xa8);
    }
    goto LAB_002bf108;
  case 0xc:
    if (*(long *)_o == 0) {
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(*(long *)_o + 0xb0);
      uVar6 = (undefined4)uVar4;
      uVar7 = (undefined4)((ulong)uVar4 >> 0x20);
    }
    *(ulong *)*pauVar1 = CONCAT44(uVar7,uVar6);
    return;
  case 0xd:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x30);
      dVar12 = *(double *)(lVar5 + 0x38);
      goto LAB_002bf108;
    }
    break;
  case 0xe:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x30);
      dVar12 = *(double *)(lVar5 + 0x38);
LAB_002bf05a:
      dVar13 = *(double *)(lVar5 + 0x50);
      dVar14 = *(double *)(lVar5 + 0x58);
      uVar6 = *(undefined4 *)(lVar5 + 0x60);
      uVar7 = *(undefined4 *)(lVar5 + 100);
      uVar8 = *(undefined4 *)(lVar5 + 0x68);
      uVar9 = *(undefined4 *)(lVar5 + 0x6c);
LAB_002bf0eb:
      dVar10 = ((double)CONCAT44(uVar7,uVar6) - dVar13) + dVar10;
      dVar12 = ((double)CONCAT44(uVar9,uVar8) - dVar14) + dVar12;
      goto LAB_002bf108;
    }
    break;
  case 0xf:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x30);
      dVar12 = *(double *)(lVar5 + 0x38);
LAB_002bf0e1:
      dVar13 = *(double *)(lVar5 + 0x50);
      dVar14 = *(double *)(lVar5 + 0x58);
      uVar6 = *(undefined4 *)(lVar5 + 0x70);
      uVar7 = *(undefined4 *)(lVar5 + 0x74);
      uVar8 = *(undefined4 *)(lVar5 + 0x78);
      uVar9 = *(undefined4 *)(lVar5 + 0x7c);
      goto LAB_002bf0eb;
    }
    break;
  case 0x10:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x30);
      dVar12 = *(double *)(lVar5 + 0x38);
LAB_002befe3:
      dVar13 = *(double *)(lVar5 + 0x50);
      dVar14 = *(double *)(lVar5 + 0x58);
      uVar6 = *(undefined4 *)(lVar5 + 0x80);
      uVar7 = *(undefined4 *)(lVar5 + 0x84);
      uVar8 = *(undefined4 *)(lVar5 + 0x88);
      uVar9 = *(undefined4 *)(lVar5 + 0x8c);
      goto LAB_002bf0eb;
    }
    break;
  case 0x11:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x40);
      dVar12 = *(double *)(lVar5 + 0x48);
      goto LAB_002bf108;
    }
    break;
  case 0x12:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x40);
      dVar12 = *(double *)(lVar5 + 0x48);
      goto LAB_002bf05a;
    }
    break;
  case 0x13:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x40);
      dVar12 = *(double *)(lVar5 + 0x48);
      goto LAB_002bf0e1;
    }
    break;
  case 0x14:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x40);
      dVar12 = *(double *)(lVar5 + 0x48);
      goto LAB_002befe3;
    }
    break;
  case 0x15:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x50);
      dVar12 = *(double *)(lVar5 + 0x58);
      goto LAB_002bf108;
    }
    break;
  case 0x16:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x60);
      dVar12 = *(double *)(lVar5 + 0x68);
      goto LAB_002bf108;
    }
    break;
  case 0x17:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x70);
      dVar12 = *(double *)(lVar5 + 0x78);
      goto LAB_002bf108;
    }
    break;
  case 0x18:
    lVar5 = *(long *)_o;
    if (lVar5 != 0) {
      dVar10 = *(double *)(lVar5 + 0x80);
      dVar12 = *(double *)(lVar5 + 0x88);
      goto LAB_002bf108;
    }
  }
  dVar10 = 0.0;
  dVar12 = 0.0;
LAB_002bf108:
  auVar2._8_4_ = SUB84(dVar12,0);
  auVar2._0_8_ = dVar10;
  auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
  *pauVar1 = auVar2;
  return;
}

Assistant:

void QEventPoint::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QEventPoint *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isAccepted(); break;
        case 1: *reinterpret_cast<const QPointingDevice**>(_v) = _t->device(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->id(); break;
        case 3: *reinterpret_cast<QPointingDeviceUniqueId*>(_v) = _t->uniqueId(); break;
        case 4: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 5: *reinterpret_cast<ulong*>(_v) = _t->timestamp(); break;
        case 6: *reinterpret_cast<ulong*>(_v) = _t->pressTimestamp(); break;
        case 7: *reinterpret_cast<ulong*>(_v) = _t->lastTimestamp(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->timeHeld(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->pressure(); break;
        case 10: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 11: *reinterpret_cast<QSizeF*>(_v) = _t->ellipseDiameters(); break;
        case 12: *reinterpret_cast<QVector2D*>(_v) = _t->velocity(); break;
        case 13: *reinterpret_cast<QPointF*>(_v) = _t->position(); break;
        case 14: *reinterpret_cast<QPointF*>(_v) = _t->pressPosition(); break;
        case 15: *reinterpret_cast<QPointF*>(_v) = _t->grabPosition(); break;
        case 16: *reinterpret_cast<QPointF*>(_v) = _t->lastPosition(); break;
        case 17: *reinterpret_cast<QPointF*>(_v) = _t->scenePosition(); break;
        case 18: *reinterpret_cast<QPointF*>(_v) = _t->scenePressPosition(); break;
        case 19: *reinterpret_cast<QPointF*>(_v) = _t->sceneGrabPosition(); break;
        case 20: *reinterpret_cast<QPointF*>(_v) = _t->sceneLastPosition(); break;
        case 21: *reinterpret_cast<QPointF*>(_v) = _t->globalPosition(); break;
        case 22: *reinterpret_cast<QPointF*>(_v) = _t->globalPressPosition(); break;
        case 23: *reinterpret_cast<QPointF*>(_v) = _t->globalGrabPosition(); break;
        case 24: *reinterpret_cast<QPointF*>(_v) = _t->globalLastPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAccepted(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}